

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<VariableTypeRemap,_8UL>::reserve
          (SmallVector<VariableTypeRemap,_8UL> *this,size_t count)

{
  undefined8 *puVar1;
  VariableTypeRemap *pVVar2;
  char *pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  VariableTypeRemap *pVVar6;
  undefined8 *puVar7;
  long *plVar8;
  long lVar9;
  ulong uVar10;
  
  if (count >> 0x3a == 0) {
    uVar5 = this->buffer_capacity;
    if (uVar5 < count) {
      uVar10 = 8;
      if (8 < uVar5) {
        uVar10 = uVar5;
      }
      do {
        uVar5 = uVar10;
        uVar10 = uVar5 * 2;
      } while (uVar5 < count);
      if (uVar5 < 9) {
        pVVar6 = (VariableTypeRemap *)&this->stack_storage;
      }
      else {
        pVVar6 = (VariableTypeRemap *)malloc(uVar5 << 6);
      }
      if (pVVar6 == (VariableTypeRemap *)0x0) goto LAB_001a5db2;
      if ((pVVar6 != (this->super_VectorView<VariableTypeRemap>).ptr) &&
         ((this->super_VectorView<VariableTypeRemap>).buffer_size != 0)) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          pVVar2 = (this->super_VectorView<VariableTypeRemap>).ptr;
          pcVar3 = (char *)((long)&(pVVar6->variable_name)._M_dataplus._M_p + lVar9);
          *(char **)pcVar3 = pcVar3 + 0x10;
          puVar1 = (undefined8 *)((long)&(pVVar2->variable_name)._M_dataplus._M_p + lVar9);
          plVar8 = puVar1 + 2;
          if (plVar8 == (long *)*puVar1) {
            uVar4 = puVar1[3];
            *(long *)(pcVar3 + 0x10) = *plVar8;
            *(undefined8 *)(pcVar3 + 0x18) = uVar4;
          }
          else {
            pcVar3 = (char *)((long)&(pVVar6->variable_name)._M_dataplus._M_p + lVar9);
            *(long **)pcVar3 = (long *)*puVar1;
            *(long *)(pcVar3 + 0x10) = *plVar8;
          }
          puVar1 = (undefined8 *)((long)&(pVVar2->variable_name)._M_dataplus._M_p + lVar9);
          puVar7 = puVar1 + 6;
          pcVar3 = (pVVar6->new_variable_type).field_2._M_local_buf + lVar9;
          *(undefined8 *)(pcVar3 + -0x28) = puVar1[1];
          *puVar1 = plVar8;
          puVar1[1] = 0;
          *(undefined1 *)(puVar1 + 2) = 0;
          *(char **)(pcVar3 + -0x10) = pcVar3;
          if (puVar7 == (undefined8 *)puVar1[4]) {
            uVar4 = puVar1[7];
            *(undefined8 *)pcVar3 = *puVar7;
            *(undefined8 *)(pcVar3 + 8) = uVar4;
          }
          else {
            *(undefined8 **)((long)&(pVVar6->new_variable_type)._M_dataplus._M_p + lVar9) =
                 (undefined8 *)puVar1[4];
            *(undefined8 *)((long)&(pVVar6->new_variable_type).field_2 + lVar9) = *puVar7;
          }
          *(undefined8 *)((long)&(pVVar6->new_variable_type)._M_string_length + lVar9) =
               *(undefined8 *)((long)&(pVVar2->new_variable_type)._M_string_length + lVar9);
          *(undefined8 **)((long)&(pVVar2->new_variable_type)._M_dataplus._M_p + lVar9) = puVar7;
          *(undefined8 *)((long)&(pVVar2->new_variable_type)._M_string_length + lVar9) = 0;
          (pVVar2->new_variable_type).field_2._M_local_buf[lVar9] = '\0';
          pVVar2 = (this->super_VectorView<VariableTypeRemap>).ptr;
          pcVar3 = *(char **)((long)&(pVVar2->new_variable_type)._M_dataplus._M_p + lVar9);
          if ((pVVar2->new_variable_type).field_2._M_local_buf + lVar9 != pcVar3) {
            operator_delete(pcVar3);
          }
          puVar1 = (undefined8 *)((long)&(pVVar2->variable_name)._M_dataplus._M_p + lVar9);
          puVar7 = (undefined8 *)*puVar1;
          if (puVar1 + 2 != puVar7) {
            operator_delete(puVar7);
          }
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x40;
        } while (uVar10 < (this->super_VectorView<VariableTypeRemap>).buffer_size);
      }
      pVVar2 = (this->super_VectorView<VariableTypeRemap>).ptr;
      if (pVVar2 != (VariableTypeRemap *)&this->stack_storage) {
        free(pVVar2);
      }
      (this->super_VectorView<VariableTypeRemap>).ptr = pVVar6;
      this->buffer_capacity = uVar5;
    }
    return;
  }
LAB_001a5db2:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > std::numeric_limits<size_t>::max() / sizeof(T)) ||
		    (count > std::numeric_limits<size_t>::max() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}